

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O0

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_1
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  uint32_t uVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  size_type sVar5;
  ostream *this_00;
  reference pvVar6;
  mapped_type *__b;
  size_type sVar7;
  reference puVar8;
  reference pvVar9;
  reference v;
  bool bVar10;
  Array_Data_Symbol local_2d0;
  uint32_t local_254;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_250;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  uint32_t local_224;
  undefined1 local_220 [4];
  int i_5;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_200;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1f0;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1c8;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  uint local_184;
  undefined1 local_180 [4];
  int _row;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_170;
  uint local_15c;
  int local_158;
  uint32_t current_col;
  int i_4;
  uint32_t last_col;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_140;
  uint local_12c;
  undefined1 local_128 [4];
  uint32_t _1st_nonZeros_pos;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  undefined1 local_100 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonZeros_pos;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d8;
  uint32_t local_c8;
  uint32_t local_c4;
  uint32_t local_c0;
  uint32_t local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  uint32_t local_b0;
  uint32_t local_ac;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t local_a0;
  int i_3;
  uint32_t minDegree;
  bool allZeros;
  Row_Edge chosenRow;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  undefined1 local_5c [8];
  Row_Edge tmp;
  int i_2;
  int i_1;
  int i;
  uint local_34;
  uint32_t r;
  uint32_t *M_local;
  Array_Data_Symbol *D_local;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *A_local;
  R10_Decoder *this_local;
  Array_Data_Symbol *result;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->c,(ulong)D->L);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->d,(ulong)*M);
  for (i_2 = 0; (uint)i_2 < D->L; i_2 = i_2 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->c,(long)i_2);
    *pvVar2 = i_2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->d,(long)i_2);
    *pvVar2 = i_2;
  }
  for (tmp.originalDegree = D->L; uVar1 = tmp.originalDegree, tmp.originalDegree < *M;
      tmp.originalDegree = tmp.originalDegree + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->d,(long)(int)tmp.originalDegree);
    *pvVar2 = uVar1;
  }
  this->A_i = 0;
  this->A_u = 0;
  for (tmp.nonZeros = 0; tmp.nonZeros < *M; tmp.nonZeros = tmp.nonZeros + 1) {
    Row_Edge::Row_Edge((Row_Edge *)local_5c);
    boost::numeric::ublas::
    row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ((ublas *)&chosenRow.originalDegree,A,(long)(int)tmp.nonZeros);
    boost::numeric::ublas::
    vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
    ::
    vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_78,
               (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&chosenRow.originalDegree);
    local_5c._4_4_ = nonZeros_In_Row(this,&local_78,0,D->L - 1);
    boost::numeric::ublas::
    vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~vector(&local_78);
    boost::numeric::ublas::
    matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~matrix_row((matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&chosenRow.originalDegree);
    tmp.position = local_5c._4_4_;
    local_5c._0_4_ = tmp.nonZeros;
    chosenRow.nonZeros = tmp.nonZeros;
    pmVar3 = std::
             map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
             ::operator[](&this->rows,&chosenRow.nonZeros);
    pmVar3->position = local_5c._0_4_;
    pmVar3->nonZeros = local_5c._4_4_;
    pmVar3->originalDegree = tmp.position;
    Row_Edge::~Row_Edge((Row_Edge *)local_5c);
  }
  do {
    if (this->A_i + this->A_u == D->L) {
      Indecoding_phase_2(&local_2d0,this,A,D,M);
      Array_Data_Symbol::operator=(__return_storage_ptr__,&local_2d0);
      Array_Data_Symbol::~Array_Data_Symbol(&local_2d0);
      return __return_storage_ptr__;
    }
    Row_Edge::Row_Edge((Row_Edge *)&minDegree);
    i_3._3_1_ = 1;
    local_a0 = 0x100001;
    local_34 = D->L + 1;
    for (local_a4 = this->A_i; uVar4 = (ulong)(int)local_a4,
        sVar5 = std::
                map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                ::size(&this->rows), uVar4 < sVar5; local_a4 = local_a4 + 1) {
      local_a8 = local_a4;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&local_a8);
      if (pmVar3->nonZeros != 0) {
        i_3._3_1_ = 0;
      }
      local_ac = local_a4;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&local_ac);
      if (pmVar3->nonZeros == 2) {
        local_b0 = local_a4;
        pmVar3 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](&this->rows,&local_b0);
        minDegree = pmVar3->position;
        unique0x00012004 = pmVar3->nonZeros;
        local_a0 = pmVar3->originalDegree;
        local_34 = unique0x00012004;
        chosenRow.position = local_a0;
        break;
      }
      local_b4 = local_a4;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&local_b4);
      bVar10 = false;
      if (pmVar3->nonZeros < local_34) {
        local_b8 = local_a4;
        pmVar3 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](&this->rows,&local_b8);
        bVar10 = pmVar3->nonZeros != 0;
      }
      if (bVar10) {
        local_bc = local_a4;
        pmVar3 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](&this->rows,&local_bc);
        minDegree = pmVar3->position;
        unique0x00012004 = pmVar3->nonZeros;
        local_a0 = pmVar3->originalDegree;
        local_34 = unique0x00012004;
        chosenRow.position = local_a0;
      }
      else {
        local_c0 = local_a4;
        pmVar3 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](&this->rows,&local_c0);
        bVar10 = false;
        if (pmVar3->nonZeros == local_34) {
          local_c4 = local_a4;
          pmVar3 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](&this->rows,&local_c4);
          bVar10 = pmVar3->originalDegree < local_a0;
        }
        if (bVar10) {
          local_c8 = local_a4;
          pmVar3 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](&this->rows,&local_c8);
          minDegree = pmVar3->position;
          unique0x00012004 = pmVar3->nonZeros;
          local_a0 = pmVar3->originalDegree;
          chosenRow.position = local_a0;
        }
      }
    }
    if ((i_3._3_1_ & 1) == 1) {
      this_00 = std::operator<<((ostream *)&std::cout,
                                "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero."
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    if (minDegree != this->A_i) {
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_d8,A,(ulong)this->A_i);
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&nonZeros_pos.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,A,_minDegree & 0xffffffff);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::swap(&local_d8,
             (matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row((matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row(&local_d8);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->d,(ulong)this->A_i);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->d,_minDegree & 0xffffffff);
      std::swap<unsigned_int>(pvVar2,pvVar6);
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&this->A_i);
      __b = std::
            map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
            ::operator[](&this->rows,&minDegree);
      std::swap<Row_Edge>(pmVar3,__b);
      uVar1 = minDegree;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&minDegree);
      pmVar3->position = uVar1;
      uVar1 = this->A_i;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&this->A_i);
      pmVar3->position = uVar1;
    }
    boost::numeric::ublas::
    row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ((ublas *)local_128,A,(ulong)this->A_i);
    boost::numeric::ublas::
    vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
    ::
    vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_118,
               (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_128);
    find_nonZeros_pos_In_Row
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,this,&local_118,
               this->A_i,~this->A_u + D->L);
    boost::numeric::ublas::
    vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~vector(&local_118);
    boost::numeric::ublas::
    matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~matrix_row((matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_128);
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,0);
    local_12c = *pvVar2;
    if (this->A_i != local_12c) {
      boost::numeric::ublas::
      column<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_140,A,(ulong)this->A_i);
      boost::numeric::ublas::
      column<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&i_4,A,(ulong)local_12c);
      boost::numeric::ublas::
      matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::swap(&local_140,
             (matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&i_4);
      boost::numeric::ublas::
      matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_column((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&i_4);
      boost::numeric::ublas::
      matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_column(&local_140);
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->c,(ulong)this->A_i);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->c,(ulong)local_12c);
      std::swap<unsigned_int>(pvVar2,pvVar6);
    }
    current_col = (D->L - this->A_u) - 1;
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
    local_158 = (int)sVar7;
    while (local_158 = local_158 + -1, 0 < local_158) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,
                          (long)local_158);
      local_15c = *pvVar2;
      if (local_15c != current_col) {
        boost::numeric::ublas::
        column<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ((ublas *)&local_170,A,(ulong)local_15c);
        boost::numeric::ublas::
        column<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ((ublas *)local_180,A,(ulong)current_col);
        boost::numeric::ublas::
        matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::swap(&local_170,
               (matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_180);
        boost::numeric::ublas::
        matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~matrix_column((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_180);
        boost::numeric::ublas::
        matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~matrix_column(&local_170);
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->c,(ulong)local_15c);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->c,(ulong)current_col);
        std::swap<unsigned_int>(pvVar2,pvVar6);
      }
      current_col = current_col - 1;
    }
    local_184 = this->A_i;
    while (local_184 = local_184 + 1, local_184 < *M) {
      puVar8 = boost::numeric::ublas::
               matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator()(A,(long)(int)local_184,(ulong)this->A_i);
      if (*puVar8 != '\0') {
        boost::numeric::ublas::
        row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ((ublas *)&local_1c8,A,(ulong)this->A_i);
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::
        vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1b8,
                   (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_1c8);
        boost::numeric::ublas::
        row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ((ublas *)&local_1f0,A,(long)(int)local_184);
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::
        vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_1e0,
                   (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_1f0);
        Utility::matrix_row_XOR(&local_1a0,&this->util,&local_1b8,&local_1e0);
        boost::numeric::ublas::
        row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ((ublas *)&local_200,A,(long)(int)local_184);
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
        ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                     *)&local_200,
                    (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&local_1a0);
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~matrix_row(&local_200);
        boost::numeric::ublas::
        vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~vector(&local_1a0);
        boost::numeric::ublas::
        vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~vector(&local_1e0);
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~matrix_row(&local_1f0);
        boost::numeric::ublas::
        vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~vector(&local_1b8);
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~matrix_row(&local_1c8);
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->d,(long)(int)local_184);
        pvVar9 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                           (&D->symbol,(ulong)*pvVar2);
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->d,(ulong)this->A_i);
        v = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                      (&D->symbol,(ulong)*pvVar2);
        Vector_Data_DEF::operator^((Vector_Data_DEF *)local_220,pvVar9,v);
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->d,(long)(int)local_184);
        pvVar9 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                           (&D->symbol,(ulong)*pvVar2);
        Vector_Data_DEF::operator=(pvVar9,(Vector_Data_DEF *)local_220);
        Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)local_220);
      }
    }
    this->A_i = this->A_i + 1;
    this->A_u = (local_34 - 1) + this->A_u;
    for (local_224 = this->A_i; uVar4 = (ulong)(int)local_224,
        sVar5 = std::
                map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                ::size(&this->rows), uVar4 < sVar5; local_224 = local_224 + 1) {
      boost::numeric::ublas::
      row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                ((ublas *)&local_250,A,(long)(int)local_224);
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::
      vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_240,
                 (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_250);
      uVar1 = nonZeros_In_Row(this,&local_240,this->A_i,~this->A_u + D->L);
      local_254 = local_224;
      pmVar3 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](&this->rows,&local_254);
      pmVar3->nonZeros = uVar1;
      boost::numeric::ublas::
      vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~vector(&local_240);
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~matrix_row(&local_250);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
    Row_Edge::~Row_Edge((Row_Edge *)&minDegree);
  } while( true );
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_1(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{

	uint32_t r = 0;


	class Array_Data_Symbol result;

	//printf("D.L : %d\n", D.L);

	c.resize(D.L);
	d.resize(M);

	for (int i = 0; i < D.L; i++)
	{
		c[i] = i;
		d[i] = i;
	}

	for (int i = D.L; i < M; i++)
	{
		d[i] = i;
	}

	A_i = 0;
	A_u = 0;




	//std::cout << "nonZeros: " << std::endl;
	for (int i = 0; i < M; i++)
	{
		class Row_Edge tmp;
		tmp.nonZeros = nonZeros_In_Row(row(A, i), 0, D.L - 1);
		tmp.originalDegree = tmp.nonZeros;
		tmp.position = i;		
		rows[i] = tmp;

		//printf("%d ", rows[i].nonZeros);
	}
//	std::cout << std::endl;



    // counts how many rows have been chosen already
    //uint32_t chosenRowsCounter = 0;

/*
	Let r be the minimum integer such that at least one row of A has exactly r ones in V.

      *  If r != 2, then choose a row with exactly r ones in V with
         minimum original degree among all such rows.

      *  If r = 2, then choose any row with exactly 2 ones in V that is
         part of a maximum size component in the graph defined by V.
*/

    while((A_i + A_u) !=  D.L)
    {

    	class Row_Edge chosenRow;
		bool allZeros = true;
		uint32_t minDegree = 1048576 + 1;

    	r = D.L + 1;




    	for (int i = A_i; i < rows.size() ; i++)
    	{
    		if (rows[i].nonZeros != 0)
    		{
    			allZeros = false;
    		}


    		if (rows[i].nonZeros == 2)
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;

    		//	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    			break;
    		}


    		if ((rows[i].nonZeros < r) && (rows[i].nonZeros > 0) )
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;
    			    	//		printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    		else if ((rows[i].nonZeros == r) && rows[i].originalDegree < minDegree)
    		{
    			chosenRow = rows[i];
    			minDegree = chosenRow.originalDegree;
    			    //			printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    	}

    	// there need to recode. I just do it for the testing version!!
    	if (allZeros == true)
    	{
    		std::cout << "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero." << std::endl;
    		exit(-1);
    	}

//    	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

/*
	After the row is chosen in this step the first row of A that intersects V is exchanged with the chosen row so that the chosen row is the first row that intersects V.  

*/

		if (chosenRow.position != A_i)
			{

				//swap rows of A
				row(A, A_i).swap(row(A, chosenRow.position));

				//swap symbol in d according to A operation
				std::swap(d[A_i], d[chosenRow.position]);

				// update rows map
				// printf(" size of rows : %d pos: %d deg: %d\n", rows.size(), rows[A_i].position, rows[A_i].originalDegree);
				std::swap(rows[A_i], rows[chosenRow.position]);

				rows[chosenRow.position].position = chosenRow.position;

				rows[A_i].position = A_i;

				// printf(" size of rows : %d  pos: %d deg: %d\n", rows.size(), rows[chosenRow.position].position, rows[chosenRow.position].originalDegree);
	
			}	

	//	matrix_print(A);	



	/*
 	The columns of A among those that intersect V are reordered so that one of the r ones in the chosen row appears in the first column of V and so that the remaining r-1 ones appear in the last columns of V.
	*/
 		//caculate the  non-zeros bits position in A_i row of A
 		std::vector<uint32_t> nonZeros_pos = find_nonZeros_pos_In_Row(ublas::row(A, A_i), A_i, D.L - 1 - A_u);

 		// std::cout << "nonZeros position: " << std::endl;
 		// for (int i = 0; i < nonZeros_pos.size(); i++)
 		// {
 		// 	printf("%d ", nonZeros_pos[i]);
 		// }

 	//	std::cout << std::endl << std::endl;

 		uint32_t _1st_nonZeros_pos = nonZeros_pos[0];

 		if (A_i != _1st_nonZeros_pos)
 		{
 			ublas::column(A, A_i).swap(ublas::column(A, _1st_nonZeros_pos));

 			std::swap(c[A_i], c[_1st_nonZeros_pos]);
	 	
	 	}

	 // 	std::cout << "find_nonZeros_pos_In_Row A swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	


		// swap the remaining non-zeros columns so that they are r-1 ones appear in the last columns of V
		uint32_t last_col = D.L - A_u - 1;
		for (int i = (nonZeros_pos.size() - 1); i > 0 ; i--)
		{
			// we need to know if the current column is the last column of V.
			uint32_t current_col = nonZeros_pos[i];
			if (current_col != last_col)
			{
				//if no, swap the current columns
				ublas::column(A, current_col).swap(ublas::column(A, last_col));

				std::swap(c[current_col], c[last_col]);

			}
			// move the last column of V
			last_col--;
		}
	 // 	std::cout << "remaining non-zeros of V swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	





	/*
	Then, the chosen row is exclusive-ORed into all the other rows of A below the chosen row that have a one in the first column of V. 
	*/

		for (int _row = A_i + 1; _row < M; _row++)
		{
			//check if the A_ith column if '0'
			if (A(_row, A_i) == 0)
			{
				continue;
			}

			// using chosen rows XOR with remaining in A
			ublas::row(A, _row) = util.matrix_row_XOR(ublas::row(A, A_i), ublas::row(A, _row));
			// decoding process XOR D[d[row]] and D[d[i]]
	//		printf("symbol size: %d  row: %d  A_i: %d \n",D.symbol.size(), _row, A_i);


				D.symbol[d[_row]] = D.symbol[d[_row]] ^ D.symbol[d[A_i]];

			// for (int i = 0; i < D.sym_len; ++i)
			// {
			// 	D.symbol[_row].s[i] = D.symbol[_row].s[i] ^ D.symbol[A_i].s[i];
			// }

		}

	 //  	std::cout << "A XOR :  A_u: " <<  A_u << " A_i: "<<  A_i << std::endl;

		// matrix_print(A);	

	/*
	Finally, i is incremented by 1 and u is incremented by r-1, which completes the step.
	*/

    	A_i++;
 	   	A_u += r - 1;

	//  	std::cout << "A_u: " << A_u << " A_i: "<<  A_i << std::endl; 	   	

 	   	// update non-zeros
 	   	// std::cout << "position: " << std::endl;
 	   	// for (int i = 0; i < rows.size(); ++i)
 	   	// {
 	   	// 	printf("%d ", rows[i].position);
 	   	// }
 	   	// std::cout << std::endl;


	//	std::cout << "updated nonZeros: " << std::endl;
		for (int i = A_i; i < rows.size(); i++)
		{
			//uint32_t nzpos = rows[i].position;
			rows[i].nonZeros = nonZeros_In_Row(row(A, i), A_i, D.L - A_u - 1);
			//printf("%d:%d ",rows[i].position, rows[i].nonZeros);
		}
		//std::cout << std::endl;


    }



	result = Indecoding_phase_2(A, D, M);

    return result;

}